

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O2

ssize_t __thiscall RoboClaw::read(RoboClaw *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  long lVar4;
  ssize_t sVar5;
  void *__buf_00;
  int __fd_00;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  
  __fd_00 = __fd;
  lVar3 = std::chrono::_V2::steady_clock::now();
  auVar6._8_56_ = extraout_var;
  auVar6._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar6._0_16_,__fd);
  do {
    iVar2 = available(this);
    if (iVar2 != 0) {
      sVar5 = read(this,__fd_00,__buf_00,__nbytes);
      return sVar5;
    }
    lVar4 = std::chrono::_V2::steady_clock::now();
  } while (((double)(lVar4 - lVar3) * 1000.0) / 1000000000.0 < auVar1._0_8_);
  return CONCAT71((int7)((ulong)(lVar4 - lVar3) >> 8),0xff);
}

Assistant:

uint8_t RoboClaw::read(uint32_t timeout)
{
    if( m_serial )
    {
        auto start = std::chrono::steady_clock::now();

        // Empty buffer?
        while( !available() )
        {
            auto end = std::chrono::steady_clock::now();
            auto elapsed = end-start;
            if( elapsed.count() * 1000.0 / std::chrono::steady_clock::period().den >= timeout )
            {
                return -1;
            }
        }
        return read();
    }
}